

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

void __thiscall
option::Stats::Stats
          (Stats *this,Descriptor *usage,int argc,char **argv,int min_abbr_len,
          bool single_minus_longopt)

{
  Descriptor *pDVar1;
  Descriptor *pDVar2;
  uint uVar3;
  Action local_18;
  Stats *local_10;
  
  this->buffer_max = 1;
  this->options_max = 1;
  if (usage->shortopt != (char *)0x0) {
    uVar3 = 1;
    pDVar2 = usage;
    do {
      if (uVar3 <= pDVar2->index + 1) {
        uVar3 = pDVar2->index + 2;
        this->options_max = uVar3;
      }
      pDVar1 = pDVar2 + 1;
      pDVar2 = pDVar2 + 1;
    } while (pDVar1->shortopt != (char *)0x0);
  }
  local_18._vptr_Action = (_func_int **)&PTR_perform_00120a20;
  local_10 = this;
  Parser::workhorse(false,usage,argc,argv,&local_18,single_minus_longopt,false,min_abbr_len);
  return;
}

Assistant:

Stats(const Descriptor usage[], int argc, char** argv, int min_abbr_len = 0, //
        bool single_minus_longopt = false) :
      buffer_max(1), options_max(1) // 1 more than necessary as sentinel
  {
    add(false, usage, argc, const_cast<const char**>(argv), min_abbr_len, single_minus_longopt);
  }